

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O2

void __thiscall webrtc::AecCore::AecCore(AecCore *this)

{
  this->sampFreq = 16000;
  PowerLevel::PowerLevel(&this->farlevel);
  PowerLevel::PowerLevel(&this->nearlevel);
  PowerLevel::PowerLevel(&this->linoutlevel);
  PowerLevel::PowerLevel(&this->nlpoutlevel);
  (this->divergent_filter_fraction).count_ = 0;
  (this->divergent_filter_fraction).occurrence_ = 0;
  (this->divergent_filter_fraction).fraction_ = -1.0;
  return;
}

Assistant:

AecCore::AecCore() = default;